

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O2

void save_line_proc(ostream *os,Am_Load_Save_Context *context,Am_Object *object)

{
  ushort uVar1;
  
  Am_Load_Save_Context::Save_Type_Name((ostream *)context,(char *)os);
  uVar1 = (ushort)object;
  Am_Object::Get(uVar1,0x6b);
  Am_Load_Save_Context::Save((ostream *)context,(Am_Value *)os);
  Am_Object::Get(uVar1,0x8b);
  Am_Load_Save_Context::Save((ostream *)context,(Am_Value *)os);
  Am_Object::Get(uVar1,0x8c);
  Am_Load_Save_Context::Save((ostream *)context,(Am_Value *)os);
  Am_Object::Get(uVar1,0x8d);
  Am_Load_Save_Context::Save((ostream *)context,(Am_Value *)os);
  Am_Object::Get(uVar1,0x8e);
  Am_Load_Save_Context::Save((ostream *)context,(Am_Value *)os);
  return;
}

Assistant:

Am_Define_Method(Am_Save_Object_Method, void, save_line,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Object &object))
{
  context.Save_Type_Name(os, "Proto_Line");
  context.Save(os, object.Get(Am_LINE_STYLE));
  context.Save(os, object.Get(Am_X1));
  context.Save(os, object.Get(Am_Y1));
  context.Save(os, object.Get(Am_X2));
  context.Save(os, object.Get(Am_Y2));
}